

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

int Dar2_LibEval_rec(Dar_LibObj_t *pObj,int Out)

{
  int iVar1;
  int iVar2;
  Dar_LibDat_t *pDVar3;
  Dar_LibObj_t *pDVar4;
  int Area;
  Dar_LibDat_t *pData;
  int Out_local;
  Dar_LibObj_t *pObj_local;
  
  pDVar3 = s_DarLib->pDatas + (int)(SUB84(*pObj,4) >> 4);
  if (pDVar3->TravId == Out) {
    pObj_local._4_4_ = 0;
  }
  else {
    pDVar3->TravId = Out;
    if (((ulong)*pObj >> 0x23 & 1) == 0) {
      if (SUB84(*pObj,4) >> 4 < 4) {
        __assert_fail("pObj->Num > 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                      ,0x487,"int Dar2_LibEval_rec(Dar_LibObj_t *, int)");
      }
      if ((pDVar3->field_0).iGunc < 0) {
        pDVar4 = Dar_LibObj(s_DarLib,SUB84(*pObj,0) & 0xffff);
        iVar1 = Dar2_LibEval_rec(pDVar4,Out);
        pDVar4 = Dar_LibObj(s_DarLib,SUB84(*pObj,2) & 0xffff);
        iVar2 = Dar2_LibEval_rec(pDVar4,Out);
        pObj_local._4_4_ = iVar2 + iVar1 + 1;
      }
      else {
        pObj_local._4_4_ = 0;
      }
    }
    else {
      pObj_local._4_4_ = 0;
    }
  }
  return pObj_local._4_4_;
}

Assistant:

int Dar2_LibEval_rec( Dar_LibObj_t * pObj, int Out )
{
    Dar_LibDat_t * pData;
    int Area;
    pData = s_DarLib->pDatas + pObj->Num;
    if ( pData->TravId == Out )
        return 0;
    pData->TravId = Out;
    if ( pObj->fTerm )
        return 0;
    assert( pObj->Num > 3 );
    if ( pData->iGunc >= 0 )//&& !pData->fMffc )
        return 0;
    // this is a new node - get a bound on the area of its branches
//    nNodesSaved--;
    Area = Dar2_LibEval_rec( Dar_LibObj(s_DarLib, pObj->Fan0), Out );
//    if ( Area > nNodesSaved )
//        return 0xff;
    Area += Dar2_LibEval_rec( Dar_LibObj(s_DarLib, pObj->Fan1), Out );
//    if ( Area > nNodesSaved )
//        return 0xff;
    return Area + 1;
}